

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::texparameteriv(NegativeTestContext *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  ContextType CVar3;
  GLint params [1];
  GLuint texture;
  GLint local_44;
  string local_40;
  GLuint local_1c;
  
  local_44 = 0x2601;
  local_1c = 0x1234;
  glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,1,&local_1c);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0xde1,local_1c);
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "GL_INVALID_ENUM is generated if target or pname is not one of the accepted defined values."
             ,"");
  NegativeTestContext::beginSection(ctx,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0,0x2801,&local_44);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0xde1,0,&local_44);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0,0,&local_44);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "GL_INVALID_ENUM is generated if pname is enum and the value of param(s) is not a valid value."
             ,"");
  NegativeTestContext::beginSection(ctx,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_44 = -1;
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0xde1,0x90ea,&local_44);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0xde1,0x884c,&local_44);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0xde1,0x884d,&local_44);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0xde1,0x2800,&local_44);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0xde1,0x2801,&local_44);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0xde1,0x8e42,&local_44);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0xde1,0x8e43,&local_44);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0xde1,0x8e44,&local_44);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0xde1,0x8e45,&local_44);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0xde1,0x2802,&local_44);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0xde1,0x2803,&local_44);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0xde1,0x8072,&local_44);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "GL_INVALID_VALUE is generated if pname is GL_TEXTURE_BASE_LEVEL or GL_TEXTURE_MAX_LEVEL and param(s) is negative."
             ,"");
  NegativeTestContext::beginSection(ctx,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0xde1,0x813c,&local_44);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0xde1,0x813d,&local_44);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "GL_INVALID_ENUM error is generated if target is GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY and pname is not valid."
             ,"");
  NegativeTestContext::beginSection(ctx,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0x9100,0x1004,&local_44);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0x9100,0x2801,&local_44);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0x9100,0x2800,&local_44);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0x9100,0x2802,&local_44);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0x9100,0x2803,&local_44);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0x9100,0x8072,&local_44);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0x9100,0x813a,&local_44);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0x9100,0x813b,&local_44);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0x9100,0x884c,&local_44);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0x9100,0x884d,&local_44);
  NegativeTestContext::expectError(ctx,0x500);
  CVar3.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(CVar3,(ApiType)0x23);
  if (bVar2) {
LAB_015c47cb:
    glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0x9102,0x1004,&local_44);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0x9102,0x2801,&local_44);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0x9102,0x2800,&local_44);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0x9102,0x2802,&local_44);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0x9102,0x2803,&local_44);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0x9102,0x8072,&local_44);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0x9102,0x813a,&local_44);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0x9102,0x813b,&local_44);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0x9102,0x884c,&local_44);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0x9102,0x884d,&local_44);
    NegativeTestContext::expectError(ctx,0x500);
  }
  else {
    bVar2 = glu::ContextInfo::isExtensionSupported
                      (ctx->m_ctxInfo,"GL_OES_texture_storage_multisample_2d_array");
    if (bVar2) goto LAB_015c47cb;
  }
  NegativeTestContext::endSection(ctx);
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,
             "GL_INVALID_OPERATION is generated if target is GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY and pname GL_TEXTURE_BASE_LEVEL is not 0."
             ,"");
  NegativeTestContext::beginSection(ctx,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  local_44 = 1;
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0x9100,0x813c,&local_44);
  NegativeTestContext::expectError(ctx,0x502);
  CVar3.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(CVar3,(ApiType)0x23);
  if (!bVar2) {
    bVar2 = glu::ContextInfo::isExtensionSupported
                      (ctx->m_ctxInfo,"GL_OES_texture_storage_multisample_2d_array");
    if (!bVar2) goto LAB_015c49ed;
  }
  local_44 = 1;
  glu::CallLogWrapper::glTexParameteriv(&ctx->super_CallLogWrapper,0x9102,0x813c,&local_44);
  NegativeTestContext::expectError(ctx,0x502);
LAB_015c49ed:
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glDeleteTextures(&ctx->super_CallLogWrapper,1,&local_1c);
  return;
}

Assistant:

void texparameteriv (NegativeTestContext& ctx)
{
	GLint params[1] = {GL_LINEAR};

	GLuint texture = 0x1234;
	ctx.glGenTextures(1, &texture);
	ctx.glBindTexture(GL_TEXTURE_2D, texture);

	ctx.beginSection("GL_INVALID_ENUM is generated if target or pname is not one of the accepted defined values.");
	ctx.glTexParameteriv(0, GL_TEXTURE_MIN_FILTER, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D, 0, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(0, 0, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if pname is enum and the value of param(s) is not a valid value.");
	params[0] = -1;
	ctx.glTexParameteriv(GL_TEXTURE_2D, GL_DEPTH_STENCIL_TEXTURE_MODE, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_COMPARE_MODE, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_COMPARE_FUNC, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_R, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_G, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_B, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_SWIZZLE_A, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_WRAP_R, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if pname is GL_TEXTURE_BASE_LEVEL or GL_TEXTURE_MAX_LEVEL and param(s) is negative.");
	ctx.glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_BASE_LEVEL, &params[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexParameteriv(GL_TEXTURE_2D, GL_TEXTURE_MAX_LEVEL, &params[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM error is generated if target is GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY and pname is not valid.");
	ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_BORDER_COLOR, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MIN_FILTER, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MAG_FILTER, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_WRAP_S, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_WRAP_T, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_WRAP_R, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MIN_LOD, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_MAX_LOD, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_COMPARE_MODE, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_COMPARE_FUNC, &params[0]);
	ctx.expectError(GL_INVALID_ENUM);

	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array"))
	{
		ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_BORDER_COLOR, &params[0]);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_MIN_FILTER, &params[0]);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_MAG_FILTER, &params[0]);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_WRAP_S, &params[0]);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_WRAP_T, &params[0]);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_WRAP_R, &params[0]);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_MIN_LOD, &params[0]);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_MAX_LOD, &params[0]);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_COMPARE_MODE, &params[0]);
		ctx.expectError(GL_INVALID_ENUM);
		ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_COMPARE_FUNC, &params[0]);
		ctx.expectError(GL_INVALID_ENUM);
	}
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if target is GL_TEXTURE_2D_MULTISAMPLE or GL_TEXTURE_2D_MULTISAMPLE_ARRAY and pname GL_TEXTURE_BASE_LEVEL is not 0.");
	params[0] = 1;
	ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_BASE_LEVEL, &params[0]);
	ctx.expectError(GL_INVALID_OPERATION);

	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array"))
	{
		params[0] = 1;
		ctx.glTexParameteriv(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, GL_TEXTURE_BASE_LEVEL, &params[0]);
		ctx.expectError(GL_INVALID_OPERATION);
	}
	ctx.endSection();

	ctx.glDeleteTextures(1, &texture);
}